

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

bool __thiscall
jsoncons::typed_array_visitor<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::
visit_begin_array(typed_array_visitor<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *this,size_t size,semantic_tag param_3,ser_context *param_4,error_code *ec)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  error_code *in_R8;
  conv_errc in_stack_ffffffffffffffcc;
  
  iVar1 = *(int *)(in_RDI + 0x10) + 1;
  *(int *)(in_RDI + 0x10) = iVar1;
  if (iVar1 == 1) {
    if (in_RSI != 0) {
      reserve_storage(*(undefined8 *)(in_RDI + 8),in_RSI);
    }
  }
  else {
    std::error_code::operator=(in_R8,in_stack_ffffffffffffffcc);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_array(std::size_t size, 
            semantic_tag, 
            const ser_context&, 
            std::error_code& ec) override
        {
            if (++level_ != 1)
            {
                ec = conv_errc::not_vector;
                JSONCONS_VISITOR_RETURN;
            }
            if (size > 0)
            {
                reserve_storage(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(), v_, size);
            }
            JSONCONS_VISITOR_RETURN;
        }